

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetObjectLibrariesCMP0026
          (cmGeneratorTarget *this,
          vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *objlibs)

{
  char *__s1;
  iterator __position;
  int iVar1;
  size_type sVar2;
  pointer pbVar3;
  pointer pbVar4;
  const_iterator cVar5;
  cmStringRange cVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmGeneratorTarget *objLib;
  string objLibName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *local_70;
  const_iterator local_68;
  cmGeneratorTarget *local_60;
  cmGeneratorTarget *local_58;
  string local_50;
  
  local_70 = (vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)objlibs;
  local_60 = this;
  cVar6 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
  if (cVar6.Begin._M_current._M_current != cVar6.End._M_current._M_current) {
    do {
      local_68 = cVar6.End._M_current;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(cVar6.Begin._M_current._M_current,&local_88,false);
      pbVar3 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar3; pbVar4 = pbVar4 + 1
          ) {
        __s1 = (pbVar4->_M_dataplus)._M_p;
        iVar1 = strncmp(__s1,"$<TARGET_OBJECTS:",0x11);
        if ((iVar1 == 0) && (__s1[pbVar4->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar4);
          sVar2 = cmGeneratorExpression::Find(&local_50);
          if ((sVar2 == 0xffffffffffffffff) &&
             (local_58 = cmLocalGenerator::FindGeneratorTargetToUse
                                   (local_60->LocalGenerator,&local_50),
             local_58 != (cmGeneratorTarget *)0x0)) {
            __position._M_current = *(cmGeneratorTarget ***)(local_70 + 8);
            if (__position._M_current == *(cmGeneratorTarget ***)(local_70 + 0x10)) {
              std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
              _M_realloc_insert<cmGeneratorTarget*const&>(local_70,__position,&local_58);
            }
            else {
              *__position._M_current = local_58;
              *(long *)(local_70 + 8) = *(long *)(local_70 + 8) + 8;
            }
          }
          pbVar3 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            pbVar3 = local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      cVar5._M_current = cVar6.Begin._M_current._M_current + 1;
      cVar6.End._M_current = local_68._M_current;
      cVar6.Begin._M_current = cVar5._M_current;
    } while (cVar5._M_current != local_68._M_current);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetObjectLibrariesCMP0026(
  std::vector<cmGeneratorTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  cmStringRange rng = this->Target->GetSourceEntries();
  for (std::vector<std::string>::const_iterator i = rng.begin();
       i != rng.end(); ++i) {
    std::string const& entry = *i;

    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::vector<std::string>::const_iterator li = files.begin();
         li != files.end(); ++li) {
      if (cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
          (*li)[li->size() - 1] == '>') {
        std::string objLibName = li->substr(17, li->size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          continue;
        }
        cmGeneratorTarget* objLib =
          this->LocalGenerator->FindGeneratorTargetToUse(objLibName);
        if (objLib) {
          objlibs.push_back(objLib);
        }
      }
    }
  }
}